

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ColorConvertRGBtoHSV(float r,float g,float b,float *out_h,float *out_s,float *out_v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = (float)(-(uint)(g < b) & 0xbf800000);
  fVar3 = b;
  if (b <= g) {
    fVar3 = g;
    g = b;
  }
  fVar4 = fVar3;
  fVar1 = r;
  if (fVar3 <= r) {
    fVar4 = r;
    fVar1 = fVar3;
  }
  fVar2 = fVar1;
  if (g <= fVar1) {
    fVar2 = g;
  }
  *out_h = ABS((fVar1 - g) / ((fVar4 - fVar2) * 6.0 + 1e-20) +
               (float)(-(uint)(r < fVar3) & (uint)(-0.33333334 - fVar5) |
                      ~-(uint)(r < fVar3) & (uint)fVar5));
  *out_s = (fVar4 - fVar2) / (fVar4 + 1e-20);
  *out_v = fVar4;
  return;
}

Assistant:

void ImGui::ColorConvertRGBtoHSV(float r, float g, float b, float& out_h, float& out_s, float& out_v)
{
    float K = 0.f;
    if (g < b)
    {
        const float tmp = g; g = b; b = tmp;
        K = -1.f;
    }
    if (r < g)
    {
        const float tmp = r; r = g; g = tmp;
        K = -2.f / 6.f - K;
    }

    const float chroma = r - (g < b ? g : b);
    out_h = fabsf(K + (g - b) / (6.f * chroma + 1e-20f));
    out_s = chroma / (r + 1e-20f);
    out_v = r;
}